

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactTriangleXYZROT::LoadableGetStateBlock_x(ChContactTriangleXYZROT *this)

{
  ChState *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_x
            ((ChContactTriangleXYZROT *)
             ((long)&(this->super_ChContactable_3vars<6,_6,_6>).super_ChContactable.
                     _vptr_ChContactable +
             (long)(this->super_ChContactable_3vars<6,_6,_6>).super_ChContactable.
                   _vptr_ChContactable[-6]),in_ESI,in_RDX);
  return;
}

Assistant:

void ChContactTriangleXYZROT::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = mnode1->GetPos().eigen();
    mD.segment(block_offset + 3, 4) = mnode1->GetRot().eigen();

    mD.segment(block_offset + 7, 3) = mnode2->GetPos().eigen();
    mD.segment(block_offset + 10, 4) = mnode2->GetRot().eigen();

    mD.segment(block_offset + 14, 3) = mnode3->GetPos().eigen();
    mD.segment(block_offset + 17, 4) = mnode3->GetRot().eigen();
}